

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

Grammar * __thiscall
xercesc_4_0::DGXMLScanner::loadDTDGrammar(DGXMLScanner *this,InputSource *src,bool toCache)

{
  ReaderMgr *this_00;
  short *psVar1;
  XMLDocumentHandler *pXVar2;
  XMLEntityHandler *pXVar3;
  XMLErrorReporter *pXVar4;
  ValidationContext *pVVar5;
  XMLStringPool *pXVar6;
  XMLValidator *pXVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  DTDGrammar *pDVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLReader *reader;
  XMLEntityDecl *this_01;
  void *__src;
  XMLCh *__dest;
  DTDElementDecl *this_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  RuntimeException *this_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  DocTypeHandler *pDVar12;
  size_t __n;
  XMLCh gDTDStr [4];
  DTDScanner dtdScanner;
  XMLCh local_b0 [4];
  DTDScanner local_a8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  pDVar11 = (DTDGrammar *)
            XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  DTDGrammar::DTDGrammar(pDVar11,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  this->fDTDGrammar = pDVar11;
  GrammarResolver::putGrammar((this->super_XMLScanner).fGrammarResolver,(Grammar *)pDVar11);
  (this->super_XMLScanner).fGrammar = &this->fDTDGrammar->super_Grammar;
  (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xb])();
  pXVar2 = (this->super_XMLScanner).fDocHandler;
  if (pXVar2 != (XMLDocumentHandler *)0x0) {
    (*pXVar2->_vptr_XMLDocumentHandler[9])();
  }
  pXVar3 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar3 != (XMLEntityHandler *)0x0) {
    (*pXVar3->_vptr_XMLEntityHandler[4])();
  }
  pXVar4 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar4 != (XMLErrorReporter *)0x0) {
    (*pXVar4->_vptr_XMLErrorReporter[3])();
  }
  (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[4])();
  pVVar5 = (this->super_XMLScanner).fValidationContext;
  (*pVVar5->_vptr_ValidationContext[9])(pVVar5,0);
  (this->super_XMLScanner).fEntityDeclPoolRetrieved = false;
  if (toCache) {
    pXVar6 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar8 = (*src->_vptr_InputSource[5])(src);
    uVar9 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[5])
                      (pXVar6,CONCAT44(extraout_var,iVar8));
    pXVar6 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
    iVar8 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[10])(pXVar6,(ulong)uVar9);
    GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
    iVar10 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[0x16])
                       ();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x50))
              ((long *)CONCAT44(extraout_var_00,iVar10),iVar8);
    GrammarResolver::putGrammar
              ((this->super_XMLScanner).fGrammarResolver,(this->super_XMLScanner).fGrammar);
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,false,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    builtin_memcpy(local_b0,L"DTD",8);
    this_01 = (XMLEntityDecl *)XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
    XMLEntityDecl::XMLEntityDecl(this_01,local_b0,(this->super_XMLScanner).fMemoryManager);
    (this_01->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_00408758;
    *(undefined2 *)&this_01[1].super_XSerializable._vptr_XSerializable = 0;
    *(undefined1 *)((long)&this_01[1].super_XSerializable._vptr_XSerializable + 2) = 0;
    iVar8 = (*src->_vptr_InputSource[5])(src);
    __src = (void *)CONCAT44(extraout_var_01,iVar8);
    if (this_01->fSystemId != (XMLCh *)0x0) {
      (*this_01->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (__src == (void *)0x0) {
      __dest = (XMLCh *)0x0;
    }
    else {
      __n = 0;
      do {
        psVar1 = (short *)((long)__src + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar8 = (*this_01->fMemoryManager->_vptr_MemoryManager[3])(this_01->fMemoryManager,__n);
      __dest = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
      memcpy(__dest,__src,__n);
    }
    this_01->fSystemId = __dest;
    this_01->fIsExternal = true;
    reader->fThrowAtEnd = true;
    ReaderMgr::pushReaderAdoptEntity(this_00,reader,this_01,true);
    if ((this->super_XMLScanner).fDocTypeHandler == (DocTypeHandler *)0x0) {
      pDVar12 = (DocTypeHandler *)0x0;
    }
    else {
      this_02 = (DTDElementDecl *)
                XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      DTDElementDecl::DTDElementDecl
                (this_02,local_b0,(this->super_XMLScanner).fEmptyNamespaceId,Any,
                 (this->super_XMLScanner).fGrammarPoolMemoryManager);
      (this_02->super_XMLElementDecl).fCreateReason = AsRootElem;
      (this_02->super_XMLElementDecl).fExternalElement = true;
      pDVar12 = (this->super_XMLScanner).fDocTypeHandler;
      iVar8 = (*src->_vptr_InputSource[4])(src);
      iVar10 = (*src->_vptr_InputSource[5])(src);
      (*pDVar12->_vptr_DocTypeHandler[4])
                (pDVar12,this_02,CONCAT44(extraout_var_03,iVar8),CONCAT44(extraout_var_04,iVar10),0,
                 1);
      (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(this_02);
      pDVar12 = (this->super_XMLScanner).fDocTypeHandler;
    }
    DTDScanner::DTDScanner
              (&local_a8,(DTDGrammar *)(this->super_XMLScanner).fGrammar,pDVar12,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo
              (&local_a8,&this->super_XMLScanner,this_00,&(this->super_XMLScanner).fBufMgr);
    DTDScanner::scanExtSubsetDecl(&local_a8,false,true);
    if ((this->super_XMLScanner).fValidate == true) {
      pXVar7 = (this->super_XMLScanner).fValidator;
      (*pXVar7->_vptr_XMLValidator[4])(pXVar7,0,1);
    }
    if (toCache) {
      GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
    }
    pDVar11 = this->fDTDGrammar;
    DTDScanner::~DTDScanner(&local_a8);
    return &pDVar11->super_Grammar;
  }
  iVar8 = (*src->_vptr_InputSource[6])(src);
  this_03 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar8 == '\0') {
    iVar8 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x849,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_06,iVar8),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar8 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_03,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x847,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var_05,iVar8),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  __cxa_throw(this_03,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

Grammar* DGXMLScanner::loadDTDGrammar(const InputSource& src,
                                      const bool toCache)
{
    // Reset the validators
    fDTDValidator->reset();
    if (fValidatorFromUser)
        fValidator->reset();

    fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
    fGrammarResolver->putGrammar(fDTDGrammar);
    fGrammar = fDTDGrammar;
    fValidator->setGrammar(fGrammar);

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    if (toCache) {

        unsigned int sysId = fGrammarResolver->getStringPool()->addOrFind(src.getSystemId());
        const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(sysId);

        fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
        ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
        fGrammarResolver->putGrammar(fGrammar);
    }

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , false
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );
    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    //  In order to make the processing work consistently, we have to
    //  make this look like an external entity. So create an entity
    //  decl and fill it in and push it with the reader, as happens
    //  with an external entity. Put a janitor on it to insure it gets
    //  cleaned up. The reader manager does not adopt them.
    const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
    DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
    declDTD->setSystemId(src.getSystemId());
    declDTD->setIsExternal(true);

    // Mark this one as a throw at end
    newReader->setThrowAtEnd(true);

    // And push it onto the stack, with its pseudo name
    fReaderMgr.pushReaderAdoptEntity(newReader, declDTD);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler) {

        // Create a dummy root
        DTDElementDecl* rootDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            gDTDStr
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
        rootDecl->setExternalElemDeclaration(true);
        Janitor<DTDElementDecl> janSrc(rootDecl);

        fDocTypeHandler->doctypeDecl(*rootDecl, src.getPublicId(), src.getSystemId(), false, true);
    }

    // Create DTDScanner
    DTDScanner dtdScanner
    (
        (DTDGrammar*)fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    // Tell it its not in an include section
    dtdScanner.scanExtSubsetDecl(false, true);

    if (fValidate) {
        //  validate the DTD scan so far
        fValidator->preContentValidation(false, true);
    }

    if (toCache)
        fGrammarResolver->cacheGrammars();

    return fDTDGrammar;
}